

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O3

Dar_Cut_t * Dar_ObjComputeCuts(Dar_Man_t *p,Aig_Obj_t *pObj,int fSkipTtMin)

{
  Vec_Ptr_t *pVVar1;
  int Var;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  ulong uVar7;
  Dar_Cut_t *pDVar8;
  ulong uVar9;
  sbyte sVar10;
  Dar_Cut_t *pDVar11;
  long lVar12;
  Dar_Cut_t *pDVar13;
  uint uVar14;
  uint uVar15;
  Dar_Cut_t *pDVar16;
  uint uVar17;
  uint uVar18;
  Dar_Cut_t *pDVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  Dar_Cut_t *pDVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  bool bVar29;
  
  pAVar5 = Aig_ObjReal_rec(pObj->pFanin0);
  pAVar6 = Aig_ObjReal_rec(pObj->pFanin1);
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2eb,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2ec,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
  }
  if ((pObj->field_5).pData != (void *)0x0) {
    __assert_fail("Dar_ObjCuts(pObj) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2ed,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
  }
  uVar7 = (ulong)pAVar5 & 0xfffffffffffffffe;
  if (*(long *)(uVar7 + 0x28) == 0) {
    __assert_fail("Dar_ObjCuts(pFaninR0) != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2ee,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
  }
  uVar28 = (ulong)pAVar6 & 0xfffffffffffffffe;
  if (*(long *)(uVar28 + 0x28) == 0) {
    __assert_fail("Dar_ObjCuts(pFaninR1) != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2ef,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
  }
  pDVar8 = Dar_ObjPrepareCuts(p,pObj);
  uVar20 = *(ulong *)(uVar7 + 0x18);
  if (uVar20 >> 0x38 != 0) {
    pDVar25 = *(Dar_Cut_t **)(uVar7 + 0x28);
    uVar15 = 0;
    do {
      if (((pDVar25->field_0x7 & 0x10) != 0) && (0xffffffffffffff < *(ulong *)(uVar28 + 0x18))) {
        pDVar16 = *(Dar_Cut_t **)(uVar28 + 0x28);
        uVar14 = 0;
        do {
          if (((pDVar16->field_0x7 & 0x10) != 0) &&
             (p->nCutsAll = p->nCutsAll + 1, uVar2 = pDVar16->uSign | pDVar25->uSign,
             uVar2 = (uVar2 >> 1 & 0x55555555) + (uVar2 & 0x55555555),
             uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333),
             uVar2 = (uVar2 >> 4 & 0x7070707) + (uVar2 & 0x7070707),
             uVar2 = (uVar2 >> 8 & 0xf000f) + (uVar2 & 0xf000f),
             (uVar2 >> 0x10) + (uVar2 & 0xffff) < 5)) {
            if (*(ulong *)&pObj->field_0x18 < 0x100000000000000) {
LAB_004fa71a:
              __assert_fail("pCutMax != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                            ,0xae,"Dar_Cut_t *Dar_CutFindFree(Dar_Man_t *, Aig_Obj_t *)");
            }
            pDVar11 = (Dar_Cut_t *)(pObj->field_5).pData;
            uVar9 = *(ulong *)&pObj->field_0x18 >> 0x38;
            pDVar13 = (Dar_Cut_t *)0x0;
            uVar20 = uVar9;
            pDVar19 = pDVar11;
            do {
              uVar2 = *(uint *)&pDVar19->field_0x4;
              if ((uVar2 >> 0x1c & 1) == 0) goto LAB_004fa00e;
              if ((0x5fffffff < uVar2) &&
                 ((pDVar13 == (Dar_Cut_t *)0x0 ||
                  ((uVar2 >> 0x10 & 0x7ff) < (*(ushort *)&pDVar13->field_0x6 & 0x7ff))))) {
                pDVar13 = pDVar19;
              }
              pDVar19 = pDVar19 + 1;
              uVar2 = (int)uVar20 - 1;
              uVar20 = (ulong)uVar2;
            } while (uVar2 != 0);
            if (pDVar13 == (Dar_Cut_t *)0x0) {
              pDVar13 = (Dar_Cut_t *)0x0;
              uVar20 = uVar9;
              pDVar19 = pDVar11;
              do {
                if ((0x3fffffff < *(uint *)&pDVar19->field_0x4) &&
                   ((pDVar13 == (Dar_Cut_t *)0x0 ||
                    ((*(uint *)&pDVar19->field_0x4 >> 0x10 & 0x7ff) <
                     (*(ushort *)&pDVar13->field_0x6 & 0x7ff))))) {
                  pDVar13 = pDVar19;
                }
                pDVar19 = pDVar19 + 1;
                uVar2 = (int)uVar20 - 1;
                uVar20 = (ulong)uVar2;
              } while (uVar2 != 0);
              if (pDVar13 == (Dar_Cut_t *)0x0) {
                pDVar13 = (Dar_Cut_t *)0x0;
                do {
                  if ((pDVar13 == (Dar_Cut_t *)0x0) ||
                     ((*(ushort *)&pDVar11->field_0x6 & 0x7ff) <
                      (*(ushort *)&pDVar13->field_0x6 & 0x7ff))) {
                    pDVar13 = pDVar11;
                  }
                  pDVar11 = pDVar11 + 1;
                  uVar2 = (int)uVar9 - 1;
                  uVar9 = (ulong)uVar2;
                } while (uVar2 != 0);
                if (pDVar13 == (Dar_Cut_t *)0x0) goto LAB_004fa71a;
              }
            }
            pDVar13->field_0x7 = pDVar13->field_0x7 & 0xef;
            pDVar19 = pDVar13;
LAB_004fa00e:
            pDVar11 = pDVar25;
            pDVar13 = pDVar16;
            if (*(uint *)&pDVar16->field_0x4 >> 0x1d < *(uint *)&pDVar25->field_0x4 >> 0x1d) {
              pDVar11 = pDVar16;
              pDVar13 = pDVar25;
            }
            iVar3 = Dar_CutMergeOrdered(pDVar19,pDVar13,pDVar11);
            if (iVar3 == 0) {
              if ((pDVar19->field_0x7 & 0x10) != 0) {
                __assert_fail("!pCut->fUsed",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                              ,0x300,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)")
                ;
              }
            }
            else {
              pDVar19->uSign = pDVar16->uSign | pDVar25->uSign;
              pDVar19->field_0x7 = pDVar19->field_0x7 | 0x10;
              p->nCutsTried = p->nCutsTried + 1;
              iVar3 = Dar_CutFilter(pObj,pDVar19);
              if (iVar3 == 0) {
                uVar17 = *(uint *)&pDVar25->field_0x4 >> 0x1d;
                uVar2 = *(uint *)&pDVar19->field_0x4;
                uVar23 = 0;
                if (0x1fffffff < uVar2) {
                  uVar20 = 0;
                  uVar21 = 0;
                  uVar23 = 0;
                  do {
                    if (uVar21 == uVar17) break;
                    if (pDVar25->pLeaves[(int)uVar21] <= pDVar19->pLeaves[uVar20]) {
                      if (pDVar19->pLeaves[uVar20] != pDVar25->pLeaves[(int)uVar21])
                      goto LAB_004fa6fb;
                      uVar23 = uVar23 | 1 << ((uint)uVar20 & 0x1f);
                      uVar21 = uVar21 + 1;
                    }
                    uVar20 = uVar20 + 1;
                  } while (uVar2 >> 0x1d != uVar20);
                }
                uVar21 = *(uint *)&pDVar25->field_0x4 & 0xffff ^ -((uint)pAVar5 & 1);
                uVar18 = *(uint *)&pDVar16->field_0x4 & 0xffff ^ -((uint)pAVar6 & 1);
                uVar17 = uVar17 - 1;
                uVar24 = 3;
                iVar3 = 2;
                do {
                  if ((uVar23 >> (uVar24 & 0x1f) & 1) != 0) {
                    if ((int)uVar17 < (int)uVar24) {
                      uVar4 = 3 - uVar17;
                      if (3 < uVar17) {
                        uVar4 = 0;
                      }
                      uVar22 = uVar17;
                      if (uVar4 <= iVar3 - uVar17) goto LAB_004fa6bd;
                      do {
                        if (uVar22 == 0) {
                          uVar4 = 0x22222222;
                          uVar26 = 0x44444444;
                          sVar10 = 1;
                          uVar27 = 0x99999999;
                        }
                        else if (uVar22 == 1) {
                          uVar4 = 0xc0c0c0c;
                          uVar26 = 0x30303030;
                          sVar10 = 2;
                          uVar27 = 0xc3c3c3c3;
                        }
                        else {
                          uVar4 = 0xf000f0;
                          uVar26 = 0xf000f00;
                          sVar10 = 4;
                          uVar27 = 0xf00ff00f;
                        }
                        uVar21 = uVar21 >> sVar10 & uVar4 |
                                 uVar21 << sVar10 & uVar26 | uVar27 & uVar21;
                        uVar22 = uVar22 + 1;
                      } while ((int)uVar22 < (int)uVar24);
                    }
                    uVar17 = uVar17 - 1;
                  }
                  iVar3 = iVar3 + -1;
                  bVar29 = uVar24 != 0;
                  uVar24 = uVar24 - 1;
                } while (bVar29);
                if (uVar17 != 0xffffffff) {
LAB_004fa739:
                  __assert_fail("Var == -1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                                ,0x1e0,
                                "unsigned int Dar_CutTruthStretch(unsigned int, int, unsigned int)")
                  ;
                }
                uVar17 = *(uint *)&pDVar16->field_0x4 >> 0x1d;
                uVar23 = 0;
                if (0x1fffffff < uVar2) {
                  uVar20 = 0;
                  uVar24 = 0;
                  uVar23 = 0;
                  do {
                    if (uVar24 == uVar17) break;
                    if (pDVar16->pLeaves[(int)uVar24] <= pDVar19->pLeaves[uVar20]) {
                      if (pDVar19->pLeaves[uVar20] != pDVar16->pLeaves[(int)uVar24]) {
LAB_004fa6fb:
                        __assert_fail("pCut->pLeaves[i] == pCut1->pLeaves[k]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                                      ,400,
                                      "unsigned int Dar_CutTruthPhase(Dar_Cut_t *, Dar_Cut_t *)");
                      }
                      uVar23 = uVar23 | 1 << ((uint)uVar20 & 0x1f);
                      uVar24 = uVar24 + 1;
                    }
                    uVar20 = uVar20 + 1;
                  } while (uVar2 >> 0x1d != uVar20);
                }
                uVar17 = uVar17 - 1;
                uVar24 = 3;
                iVar3 = 2;
                do {
                  if ((uVar23 >> (uVar24 & 0x1f) & 1) != 0) {
                    if ((int)uVar17 < (int)uVar24) {
                      uVar4 = 3 - uVar17;
                      if (3 < uVar17) {
                        uVar4 = 0;
                      }
                      uVar22 = uVar17;
                      if (uVar4 <= iVar3 - uVar17) {
LAB_004fa6bd:
                        __assert_fail("iVar >= 0 && iVar <= 2",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                                      ,0x1a4,
                                      "unsigned int Dar_CutTruthSwapAdjacentVars(unsigned int, int)"
                                     );
                      }
                      do {
                        if (uVar22 == 0) {
                          uVar4 = 0x22222222;
                          uVar26 = 0x44444444;
                          sVar10 = 1;
                          uVar27 = 0x99999999;
                        }
                        else if (uVar22 == 1) {
                          uVar4 = 0xc0c0c0c;
                          uVar26 = 0x30303030;
                          sVar10 = 2;
                          uVar27 = 0xc3c3c3c3;
                        }
                        else {
                          uVar4 = 0xf000f0;
                          uVar26 = 0xf000f00;
                          sVar10 = 4;
                          uVar27 = 0xf00ff00f;
                        }
                        uVar18 = uVar18 >> sVar10 & uVar4 |
                                 uVar18 << sVar10 & uVar26 | uVar27 & uVar18;
                        uVar22 = uVar22 + 1;
                      } while ((int)uVar22 < (int)uVar24);
                    }
                    uVar17 = uVar17 - 1;
                  }
                  iVar3 = iVar3 + -1;
                  bVar29 = uVar24 != 0;
                  uVar24 = uVar24 - 1;
                } while (bVar29);
                if (uVar17 != 0xffffffff) goto LAB_004fa739;
                uVar23 = uVar21 & uVar18 & 0xffff;
                uVar17 = uVar23 + (uVar2 & 0xffff0000);
                *(uint *)&pDVar19->field_0x4 = uVar17;
                if (fSkipTtMin == 0) {
                  if ((uVar2 >> 0x1c & 1) == 0) {
                    __assert_fail("pCut->fUsed",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                                  ,0x262,"int Dar_CutSuppMinimize(Dar_Cut_t *)");
                  }
                  if (0x1fffffff < uVar2) {
                    uVar18 = uVar2 >> 0x1d;
                    uVar20 = 0;
                    uVar24 = 0;
                    uVar21 = uVar18;
                    do {
                      uVar4 = 1 << ((byte)uVar20 & 0x1f);
                      bVar29 = ((&DAT_009f4e10)[uVar20 * 2] & uVar23) ==
                               ((&DAT_009f4e14)[uVar20 * 2] & uVar23) >> ((byte)uVar4 & 0x1f);
                      if (bVar29) {
                        uVar4 = 0;
                      }
                      uVar24 = uVar24 | uVar4;
                      uVar21 = uVar21 - bVar29;
                      uVar20 = uVar20 + 1;
                    } while (uVar18 != uVar20);
                    if (uVar21 != uVar18) {
                      iVar3 = 0;
                      uVar17 = 0;
                      do {
                        uVar18 = uVar17;
                        if ((uVar24 >> (uVar17 & 0x1f) & 1) != 0) {
                          while (iVar3 < (int)uVar18) {
                            uVar4 = uVar18 - 1;
                            if (2 < uVar4) goto LAB_004fa6bd;
                            if (uVar18 == 2) {
                              uVar22 = 0xc0c0c0c;
                              uVar26 = 0x30303030;
                              uVar27 = 0xc3c3c3c3;
                            }
                            else if (uVar18 == 1) {
                              uVar22 = 0x22222222;
                              uVar26 = 0x44444444;
                              uVar27 = 0x99999999;
                            }
                            else {
                              uVar22 = 0xf000f0;
                              uVar26 = 0xf000f00;
                              uVar18 = 4;
                              uVar27 = 0xf00ff00f;
                            }
                            uVar23 = uVar23 >> ((byte)uVar18 & 0x1f) & uVar22 |
                                     uVar23 << ((byte)uVar18 & 0x1f) & uVar26 | uVar27 & uVar23;
                            uVar18 = uVar4;
                          }
                          iVar3 = iVar3 + 1;
                        }
                        uVar17 = uVar17 + 1;
                      } while (uVar17 != 4);
                      uVar2 = uVar23 & 0xffff | uVar2 & 0xffff0000;
                      *(uint *)&pDVar19->field_0x4 = uVar2;
                      pDVar19->uSign = 0;
                      uVar20 = 0;
                      uVar17 = 0;
                      do {
                        if ((uVar24 >> ((uint)uVar20 & 0x1f) & 1) != 0) {
                          iVar3 = pDVar19->pLeaves[uVar20];
                          lVar12 = (long)(int)uVar17;
                          uVar17 = uVar17 + 1;
                          pDVar19->pLeaves[lVar12] = iVar3;
                          pDVar19->uSign = pDVar19->uSign | 1 << ((byte)iVar3 & 0x1f);
                          uVar2 = *(uint *)&pDVar19->field_0x4;
                        }
                        uVar20 = uVar20 + 1;
                      } while (uVar20 < uVar2 >> 0x1d);
                      if (uVar17 != uVar21) {
                        __assert_fail("k == nLeaves",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                                      ,0x278,"int Dar_CutSuppMinimize(Dar_Cut_t *)");
                      }
                      *(uint *)&pDVar19->field_0x4 = uVar2 & 0x1fffffff | uVar21 * 0x20000000;
                      iVar3 = Dar_CutFilter(pObj,pDVar19);
                      if (iVar3 != 0) {
                        __assert_fail("!RetValue",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                                      ,0x311,
                                      "Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)"
                                     );
                      }
                      uVar17 = *(uint *)&pDVar19->field_0x4;
                    }
                  }
                }
                if ((uVar17 >> 0x1c & 1) == 0) {
                  __assert_fail("pCut->fUsed",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                                ,0x6e,"int Dar_CutFindValue(Dar_Man_t *, Dar_Cut_t *)");
                }
                uVar2 = 0x3e9;
                if (0x1fffffff < uVar17) {
                  pVVar1 = p->pAig->vObjs;
                  if (pVVar1 == (Vec_Ptr_t *)0x0) {
                    uVar2 = 0;
                  }
                  else {
                    uVar20 = 0;
                    uVar21 = 0;
                    uVar23 = 0;
                    do {
                      iVar3 = pDVar19->pLeaves[uVar20];
                      if (((long)iVar3 < 0) || (pVVar1->nSize <= iVar3)) {
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                      }
                      if (pVVar1->pArray[iVar3] == (void *)0x0) {
                        uVar2 = 0;
                        goto LAB_004fa591;
                      }
                      uVar18 = *(uint *)((long)pVVar1->pArray[iVar3] + 0x18) >> 6;
                      uVar23 = uVar23 + uVar18;
                      uVar21 = uVar21 + (uVar18 == 1);
                      uVar20 = uVar20 + 1;
                    } while (uVar17 >> 0x1d != uVar20);
                    if (0x3fffffff < uVar17) {
                      if (999 < uVar23) {
                        uVar23 = 1000;
                      }
                      uVar2 = 5 - uVar21;
                      if (uVar21 < 4) {
                        uVar2 = uVar23;
                      }
                    }
                  }
                }
LAB_004fa591:
                *(uint *)&pDVar19->field_0x4 = uVar17 & 0xf800ffff | (uVar2 & 0x7ff) << 0x10;
                if ((uVar2 & 0x7ff) == 0) {
                  p->nCutsSkipped = p->nCutsSkipped + 1;
                  pDVar19->field_0x7 = pDVar19->field_0x7 & 0xef;
                }
                else if (uVar17 < 0x40000000) {
                  return pDVar8;
                }
              }
              else if ((pDVar19->field_0x7 & 0x10) != 0) {
                __assert_fail("!pCut->fUsed",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                              ,0x307,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)")
                ;
              }
            }
          }
          uVar14 = uVar14 + 1;
          pDVar16 = pDVar16 + 1;
        } while (uVar14 < *(byte *)(uVar28 + 0x1f));
        uVar20 = *(ulong *)(uVar7 + 0x18);
      }
      uVar15 = uVar15 + 1;
      pDVar25 = pDVar25 + 1;
    } while (uVar15 < (byte)(uVar20 >> 0x38));
  }
  uVar7 = *(ulong *)&pObj->field_0x18;
  if (0xffffffffffffff < uVar7) {
    lVar12 = (long)(pObj->field_5).pData + 4;
    uVar15 = 0;
    do {
      if ((*(byte *)(lVar12 + 3) & 0x10) != 0) {
        p->nCutsUsed = p->nCutsUsed + 1;
        uVar7 = *(ulong *)&pObj->field_0x18;
      }
      uVar15 = uVar15 + 1;
      lVar12 = lVar12 + 0x18;
    } while (uVar15 < (byte)(uVar7 >> 0x38));
  }
  p->nCutsUsed = p->nCutsUsed + -1;
  return pDVar8;
}

Assistant:

Dar_Cut_t * Dar_ObjComputeCuts( Dar_Man_t * p, Aig_Obj_t * pObj, int fSkipTtMin )
{
    Aig_Obj_t * pFanin0 = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
    Aig_Obj_t * pFanin1 = Aig_ObjReal_rec( Aig_ObjChild1(pObj) );
    Aig_Obj_t * pFaninR0 = Aig_Regular(pFanin0);
    Aig_Obj_t * pFaninR1 = Aig_Regular(pFanin1);
    Dar_Cut_t * pCutSet, * pCut0, * pCut1, * pCut;
    int i, k; 

    assert( !Aig_IsComplement(pObj) );
    assert( Aig_ObjIsNode(pObj) );
    assert( Dar_ObjCuts(pObj) == NULL );
    assert( Dar_ObjCuts(pFaninR0) != NULL );
    assert( Dar_ObjCuts(pFaninR1) != NULL );

    // set up the first cut
    pCutSet = Dar_ObjPrepareCuts( p, pObj );
    // make sure fanins cuts are computed
    Dar_ObjForEachCut( pFaninR0, pCut0, i )
    Dar_ObjForEachCut( pFaninR1, pCut1, k )
    {
        p->nCutsAll++;
        // make sure K-feasible cut exists
        if ( Dar_WordCountOnes(pCut0->uSign | pCut1->uSign) > 4 )
            continue;
        // get the next cut of this node
        pCut = Dar_CutFindFree( p, pObj );
        // create the new cut
        if ( !Dar_CutMerge( pCut, pCut0, pCut1 ) )
        {
            assert( !pCut->fUsed );
            continue;
        }
        p->nCutsTried++;
        // check dominance
        if ( Dar_CutFilter( pObj, pCut ) )
        {
            assert( !pCut->fUsed );
            continue;
        }
        // compute truth table
        pCut->uTruth = 0xFFFF & Dar_CutTruth( pCut, pCut0, pCut1, Aig_IsComplement(pFanin0), Aig_IsComplement(pFanin1) );

        // minimize support of the cut
        if ( !fSkipTtMin && Dar_CutSuppMinimize( pCut ) )
        {
            int RetValue = Dar_CutFilter( pObj, pCut );
            assert( !RetValue );
        }

        // assign the value of the cut
        pCut->Value = Dar_CutFindValue( p, pCut );
        // if the cut contains removed node, do not use it
        if ( pCut->Value == 0 )
        {
            p->nCutsSkipped++;
            pCut->fUsed = 0;
        }
        else if ( pCut->nLeaves < 2 )
            return pCutSet;
    }
    // count the number of nontrivial cuts cuts
    Dar_ObjForEachCut( pObj, pCut, i )
        p->nCutsUsed += pCut->fUsed;
    // discount trivial cut
    p->nCutsUsed--;
    return pCutSet;
}